

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O1

int WebRtcIsac_GetMinBytes
              (RateModel *State,int StreamSize,int FrameSamples,double BottleNeck,
              double DelayBuildUp,ISACBandwidth bandwidth)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = State->InitCounter;
  dVar4 = (double)FrameSamples;
  if (iVar1 < 1) {
    if (State->BurstCounter == 0) {
      dVar3 = 0.0;
    }
    else {
      if (DelayBuildUp * 0.6666666666666667 <= State->StillBuffered) {
        dVar3 = (((DelayBuildUp - State->StillBuffered) * 16.0) / dVar4 + 1.0) * BottleNeck;
        if (dVar3 < BottleNeck * 1.04) {
          dVar3 = BottleNeck * 1.04;
        }
      }
      else {
        dVar3 = ((DelayBuildUp * 16.0) / (double)(FrameSamples * 3) + 1.0) * BottleNeck;
      }
      State->BurstCounter = State->BurstCounter + -1;
    }
  }
  else {
    State->InitCounter = iVar1 + -1;
    dVar3 = 0.0;
    if (iVar1 < 6) {
      dVar3 = *(double *)(&DAT_0019fe70 + (ulong)(bandwidth == isac8kHz) * 8);
    }
  }
  iVar1 = (int)((dVar3 * dVar4) / 128000.0);
  if (StreamSize < iVar1) {
    StreamSize = iVar1;
  }
  if (((double)StreamSize * 8.0 * 16000.0) / dVar4 <= BottleNeck * 1.01) {
    State->PrevExceed = 0;
    iVar2 = FrameSamples + 0xf;
    if (-1 < FrameSamples) {
      iVar2 = FrameSamples;
    }
    State->ExceedAgo = State->ExceedAgo + (iVar2 >> 4);
  }
  else if (State->PrevExceed == 0) {
    iVar2 = FrameSamples + 0xf;
    if (-1 < FrameSamples) {
      iVar2 = FrameSamples;
    }
    State->ExceedAgo = State->ExceedAgo + (iVar2 >> 4);
    State->PrevExceed = 1;
  }
  else {
    iVar2 = 0;
    if (0xf9 < State->ExceedAgo) {
      iVar2 = State->ExceedAgo + -0xfa;
    }
    State->ExceedAgo = iVar2;
  }
  if ((500 < State->ExceedAgo) && (State->BurstCounter == 0)) {
    State->BurstCounter = (State->PrevExceed == 0) + 2;
  }
  iVar2 = FrameSamples + 0xf;
  if (-1 < FrameSamples) {
    iVar2 = FrameSamples;
  }
  dVar3 = (((double)StreamSize * 8.0 * 1000.0) / BottleNeck + State->StillBuffered) -
          (double)(iVar2 >> 4);
  dVar4 = 0.0;
  if (0.0 <= dVar3) {
    dVar4 = dVar3;
  }
  State->StillBuffered = dVar4;
  return iVar1;
}

Assistant:

int WebRtcIsac_GetMinBytes(
    RateModel*         State,
    int                StreamSize,    /* bytes in bitstream */
    const int          FrameSamples,  /* samples per frame */
    const double       BottleNeck,    /* bottle neck rate; excl headers (bps) */
    const double       DelayBuildUp,  /* max delay from bottleneck buffering (ms) */
    enum ISACBandwidth bandwidth
    /*,int16_t        frequentLargePackets*/)
{
  double MinRate = 0.0;
  int    MinBytes;
  double TransmissionTime;
  int    burstInterval = BURST_INTERVAL;

  // first 10 packets @ low rate, then INIT_BURST_LEN packets @
  // fixed rate of INIT_RATE bps
  if (State->InitCounter > 0)
  {
    if (State->InitCounter-- <= INIT_BURST_LEN)
    {
      if(bandwidth == isac8kHz)
      {
        MinRate = INIT_RATE_WB;
      }
      else
      {
        MinRate = INIT_RATE_SWB;
      }
    }
    else
    {
      MinRate = 0;
    }
  }
  else
  {
    /* handle burst */
    if (State->BurstCounter)
    {
      if (State->StillBuffered < (1.0 - 1.0/BURST_LEN) * DelayBuildUp)
      {
        /* max bps derived from BottleNeck and DelayBuildUp values */
        MinRate = (1.0 + (FS/1000) * DelayBuildUp /
                   (double)(BURST_LEN * FrameSamples)) * BottleNeck;
      }
      else
      {
        // max bps derived from StillBuffered and DelayBuildUp
        // values
        MinRate = (1.0 + (FS/1000) * (DelayBuildUp -
                                      State->StillBuffered) / (double)FrameSamples) * BottleNeck;
        if (MinRate < 1.04 * BottleNeck)
        {
          MinRate = 1.04 * BottleNeck;
        }
      }
      State->BurstCounter--;
    }
  }


  /* convert rate from bits/second to bytes/packet */
  MinBytes = (int) (MinRate * FrameSamples / (8.0 * FS));

  /* StreamSize will be adjusted if less than MinBytes */
  if (StreamSize < MinBytes)
  {
    StreamSize = MinBytes;
  }

  /* keep track of when bottle neck was last exceeded by at least 1% */
  if (StreamSize * 8.0 * FS / FrameSamples > 1.01 * BottleNeck) {
    if (State->PrevExceed) {
      /* bottle_neck exceded twice in a row, decrease ExceedAgo */
      State->ExceedAgo -= /*BURST_INTERVAL*/ burstInterval / (BURST_LEN - 1);
      if (State->ExceedAgo < 0)
        State->ExceedAgo = 0;
    }
    else
    {
      State->ExceedAgo += (FrameSamples * 1000) / FS; /* ms */
      State->PrevExceed = 1;
    }
  }
  else
  {
    State->PrevExceed = 0;
    State->ExceedAgo += (FrameSamples * 1000) / FS;     /* ms */
  }

  /* set burst flag if bottle neck not exceeded for long time */
  if ((State->ExceedAgo > burstInterval) &&
      (State->BurstCounter == 0))
  {
    if (State->PrevExceed)
    {
      State->BurstCounter = BURST_LEN - 1;
    }
    else
    {
      State->BurstCounter = BURST_LEN;
    }
  }


  /* Update buffer delay */
  TransmissionTime = StreamSize * 8.0 * 1000.0 / BottleNeck;  /* ms */
  State->StillBuffered += TransmissionTime;
  State->StillBuffered -= (FrameSamples * 1000) / FS;     /* ms */
  if (State->StillBuffered < 0.0)
  {
    State->StillBuffered = 0.0;
  }

  return MinBytes;
}